

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O3

aom_image_t * encoder_get_preview(aom_codec_alg_priv_t_conflict *ctx)

{
  int iVar1;
  aom_image_t *paVar2;
  aom_img_fmt_t aVar3;
  YV12_BUFFER_CONFIG sd;
  anon_union_8_2_2fc10223_for_yv12_buffer_config_0 local_d8;
  uint local_d0;
  uint local_c8;
  uint local_c0;
  int local_b8;
  int local_b4;
  uchar *local_b0;
  uchar *local_a8;
  uchar *local_a0;
  uchar *local_68;
  size_t local_50;
  uint local_48;
  uint local_44;
  uint local_40;
  undefined8 local_3c;
  aom_matrix_coefficients_t local_34;
  byte local_30;
  undefined8 local_2c;
  undefined8 local_24;
  byte local_18;
  
  iVar1 = av1_get_preview_raw_frame(ctx->ppi->cpi,(YV12_BUFFER_CONFIG *)&local_d8.field_0);
  if (iVar1 == 0) {
    paVar2 = &ctx->preview_img;
    if (local_44 == 0) {
      if (local_48 == 0) {
        paVar2->fmt = AOM_IMG_FMT_I444;
        iVar1 = 0x18;
        local_48 = 0;
        aVar3 = AOM_IMG_FMT_I44416;
      }
      else {
        paVar2->fmt = AOM_IMG_FMT_I422;
        iVar1 = 0x10;
        aVar3 = AOM_IMG_FMT_I42216;
      }
    }
    else {
      paVar2->fmt = AOM_IMG_FMT_I420;
      iVar1 = 0xc;
      aVar3 = AOM_IMG_FMT_I42016;
    }
    (ctx->preview_img).cp = (undefined4)local_3c;
    (ctx->preview_img).tc = local_3c._4_4_;
    (ctx->preview_img).mc = local_34;
    (ctx->preview_img).monochrome = (uint)local_30;
    (ctx->preview_img).csp = (undefined4)local_2c;
    (ctx->preview_img).range = local_2c._4_4_;
    (ctx->preview_img).bit_depth = 8;
    (ctx->preview_img).w = local_d8.field_0.y_width;
    (ctx->preview_img).h = local_d0;
    (ctx->preview_img).d_w = local_c8;
    (ctx->preview_img).d_h = local_c0;
    (ctx->preview_img).r_w = (undefined4)local_24;
    (ctx->preview_img).r_h = local_24._4_4_;
    (ctx->preview_img).x_chroma_shift = local_48;
    (ctx->preview_img).y_chroma_shift = local_44;
    (ctx->preview_img).planes[0] = local_b0;
    (ctx->preview_img).planes[1] = local_a8;
    (ctx->preview_img).planes[2] = local_a0;
    (ctx->preview_img).stride[0] = local_b8;
    (ctx->preview_img).stride[1] = local_b4;
    (ctx->preview_img).stride[2] = local_b4;
    if ((local_18 & 8) != 0) {
      iVar1 = iVar1 * 2;
      (ctx->preview_img).fmt = aVar3;
      (ctx->preview_img).bit_depth = local_40;
      (ctx->preview_img).planes[0] = (uchar *)((long)local_b0 * 2);
      (ctx->preview_img).planes[1] = (uchar *)((long)local_a8 * 2);
      (ctx->preview_img).planes[2] = (uchar *)((long)local_a0 * 2);
      (ctx->preview_img).stride[0] = local_b8 * 2;
      (ctx->preview_img).stride[1] = local_b4 * 2;
      (ctx->preview_img).stride[2] = local_b4 * 2;
    }
    (ctx->preview_img).bps = iVar1;
    (ctx->preview_img).user_priv = (void *)0x0;
    (ctx->preview_img).img_data = local_68;
    (ctx->preview_img).img_data_owner = 0;
    (ctx->preview_img).self_allocd = 0;
    (ctx->preview_img).sz = local_50;
    (ctx->preview_img).metadata = (aom_metadata_array_t *)0x0;
  }
  else {
    paVar2 = (aom_image_t *)0x0;
  }
  return paVar2;
}

Assistant:

static aom_image_t *encoder_get_preview(aom_codec_alg_priv_t *ctx) {
  YV12_BUFFER_CONFIG sd;

  if (av1_get_preview_raw_frame(ctx->ppi->cpi, &sd) == 0) {
    yuvconfig2image(&ctx->preview_img, &sd, NULL);
    return &ctx->preview_img;
  } else {
    return NULL;
  }
}